

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

decNumber * decExpOp(decNumber *res,decNumber *rhs,decContext *set,uint32_t *status)

{
  long lVar1;
  uint32_t *status_00;
  byte bVar2;
  bool bVar3;
  decContext *set_00;
  int32_t iVar4;
  decNumber *pdVar5;
  decNumber *pdVar6;
  decNumber *pdVar7;
  int iVar8;
  int extraout_EDX;
  int extraout_EDX_00;
  uint32_t uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  decNumber *dest;
  bool bVar14;
  int32_t residue;
  uint32_t ignore;
  decContext aset;
  decContext dset;
  decContext tset;
  decNumber buft [8];
  decNumber bufr [7];
  decNumber *local_280;
  decNumber *local_268;
  int32_t local_260 [2];
  decNumber *local_258;
  decNumber *local_250;
  decContext *local_248;
  decContext local_240;
  decNumber local_224;
  decContext local_218;
  decContext local_1f4;
  decNumber local_1d8 [4];
  decNumber local_1a8 [8];
  decNumber local_148 [16];
  decNumber local_88 [7];
  
  local_260[1] = 0;
  bVar2 = rhs->bits;
  if ((bVar2 & 0x70) == 0) {
    if ((rhs->lsu[0] == '\0') && (rhs->digits == 1)) {
      res->bits = '\0';
      res->lsu[0] = '\x01';
LAB_00240af1:
      res->digits = 1;
      res->exponent = 0;
    }
    else {
      local_1d8[0].bits = '\0';
      local_1d8[0].lsu[0] = '\x04';
      local_1d8[0].exponent = ~set->digits;
      if (-1 < (char)bVar2) {
        local_1d8[0].exponent = -set->digits;
      }
      local_1d8[0].digits = 1;
      iVar4 = decCompare(local_1d8,rhs,'\x01');
      if (iVar4 < 0) {
        uprv_decContextDefault_63(&local_240,0x40);
        local_240.emax = set->emax;
        local_240.emin = set->emin;
        local_240.clamp = '\0';
        uVar13 = rhs->digits;
        iVar10 = uVar13 + rhs->exponent;
        local_248 = set;
        if (iVar10 < 9) {
          uVar12 = 8U - iVar10;
          if ((int)(uint)(8 < (int)uVar13) <= (int)(8U - iVar10)) {
            uVar12 = (uint)(8 < (int)uVar13);
          }
          iVar8 = uVar13 + uVar12;
          uVar12 = uVar12 + iVar10;
          uVar11 = uVar12;
          if ((int)uVar12 < 1) {
            uVar11 = 0;
          }
          if (rhs->exponent == -iVar8 || (int)uVar12 < 0) {
            local_268 = (decNumber *)0x0;
            pdVar5 = rhs;
LAB_00240c96:
            iVar10 = set->digits;
            if (set->digits < pdVar5->digits) {
              iVar10 = pdVar5->digits;
            }
            iVar8 = iVar10 + uVar11;
            lVar1 = (long)iVar8 * 2;
            uVar12 = (int)lVar1 + 4;
            uVar13 = uVar12;
            if (iVar8 < 0x17) {
              uVar13 = (uint)""[lVar1 + 4];
            }
            iVar10 = iVar10 + uVar11 + 2;
            if (uVar13 + 0xb < 0xb5) {
              local_280 = local_148;
              pdVar6 = (decNumber *)0x0;
LAB_00240d0c:
              uVar13 = iVar8 + 4;
              if (iVar8 < 0x2e) {
                uVar13 = (uint)""[(long)iVar8 + 4];
              }
              local_258 = pdVar6;
              if (uVar13 + 0xb < 0x61) {
                dest = local_1a8;
                pdVar7 = (decNumber *)0x0;
              }
              else {
                pdVar7 = (decNumber *)uprv_malloc_63((ulong)(uVar13 + 0xb));
                pdVar6 = local_258;
                dest = pdVar7;
                if (pdVar7 == (decNumber *)0x0) goto LAB_00240d5b;
              }
              local_250 = pdVar7;
              uprv_decNumberCopy_63(dest,pdVar5);
              local_280->bits = '\0';
              local_280->lsu[0] = '\x01';
              local_280->digits = 1;
              local_280->exponent = 0;
              local_1d8[0].bits = '\0';
              local_1d8[0].lsu[0] = '\x02';
              local_1d8[0].digits = 1;
              local_1d8[0].exponent = 0;
              local_224.bits = '\0';
              local_224.lsu[0] = '\x01';
              local_224.digits = 1;
              local_224.exponent = 0;
              uprv_decContextDefault_63(&local_1f4,0x40);
              local_218.status = local_1f4.status;
              local_218.clamp = local_1f4.clamp;
              local_218._25_3_ = local_1f4._25_3_;
              local_1f4.emin = -999999999;
              status_00 = (uint32_t *)(local_260 + 1);
              local_240.digits = uVar12;
              local_1f4.digits = iVar10;
              while( true ) {
                decAddOp(local_280,local_280,dest,&local_240,'\0',status);
                decMultiplyOp(dest,dest,pdVar5,&local_1f4,status_00);
                decDivideOp(dest,dest,local_1d8,&local_1f4,0x80,status_00);
                if ((iVar10 <= local_280->digits) &&
                   (dest->digits + iVar10 + dest->exponent < local_280->digits + local_280->exponent
                   )) break;
                decAddOp(local_1d8,local_1d8,&local_224,&local_218,'\0',status_00);
              }
              bVar14 = false;
              pdVar6 = local_258;
              pdVar5 = local_250;
            }
            else {
              pdVar6 = (decNumber *)uprv_malloc_63((ulong)(uVar13 + 0xb));
              local_280 = pdVar6;
              if (pdVar6 != (decNumber *)0x0) goto LAB_00240d0c;
              local_280 = local_148;
              pdVar6 = (decNumber *)0x0;
LAB_00240d5b:
              *(byte *)status = (byte)*status | 0x10;
              bVar14 = true;
              dest = local_1a8;
              pdVar5 = (decNumber *)0x0;
            }
          }
          else {
            if ((int)uVar13 < 0x32) {
              uVar13 = (uint)""[(int)uVar13];
            }
            if (uVar13 < 0x4a) {
              pdVar5 = local_88;
              local_268 = (decNumber *)0x0;
LAB_00240c68:
              bVar14 = false;
              uprv_decNumberCopy_63(pdVar5,rhs);
              pdVar5->exponent = -iVar8;
              bVar3 = true;
              iVar10 = extraout_EDX_00;
            }
            else {
              pdVar5 = (decNumber *)uprv_malloc_63((ulong)(uVar13 + 0xb));
              local_268 = pdVar5;
              if (pdVar5 != (decNumber *)0x0) goto LAB_00240c68;
              *(byte *)status = (byte)*status | 0x10;
              bVar14 = true;
              local_268 = (decNumber *)0x0;
              bVar3 = false;
              pdVar5 = rhs;
              iVar10 = extraout_EDX;
            }
            if (bVar3) goto LAB_00240c96;
            local_280 = local_148;
            dest = local_1a8;
            pdVar5 = (decNumber *)0x0;
            pdVar6 = (decNumber *)0x0;
          }
          if (bVar14) goto LAB_00240b01;
        }
        else {
          local_280 = local_148;
          local_148[0].bits = '\0';
          local_148[0].lsu[0] = '\x02';
          local_148[0].digits = 1;
          local_148[0].exponent = 0;
          uVar11 = 8;
          iVar10 = 9;
          dest = local_1a8;
          if ((char)rhs->bits < '\0') {
            local_148[0].digits = 1;
            local_148[0].exponent = -2;
          }
          local_268 = (decNumber *)0x0;
          pdVar5 = (decNumber *)0x0;
          pdVar6 = (decNumber *)0x0;
        }
        pdVar7 = local_280;
        if (uVar11 != 0) {
          uVar9 = DECPOWERS[uVar11];
          local_240.digits = iVar10 + 2;
          dest->bits = '\0';
          dest->lsu[0] = '\x01';
          dest->digits = 1;
          dest->exponent = 0;
          bVar3 = false;
          iVar10 = 0x1e;
          while ((pdVar7 = dest, (*status & 0x2200) == 0 ||
                 (((*status >> 9 & 1) == 0 &&
                  (((dest->lsu[0] != '\0' || (dest->digits != 1)) || ((dest->bits & 0x70) != 0))))))
                ) {
            uVar9 = uVar9 * 2;
            if ((int)uVar9 < 0) {
              decMultiplyOp(dest,dest,local_280,&local_240,status);
              bVar3 = true;
            }
            bVar14 = iVar10 == 0;
            iVar10 = iVar10 + -1;
            if (bVar14) break;
            if (bVar3) {
              decMultiplyOp(dest,dest,dest,&local_240,status);
            }
          }
        }
        set_00 = local_248;
        local_260[0] = 1;
        if (((pdVar7->lsu[0] == '\0') && (pdVar7->digits == 1)) && ((pdVar7->bits & 0x70) == 0)) {
          local_260[0] = 0;
        }
        local_240.digits = local_248->digits;
        res->bits = pdVar7->bits;
        res->exponent = pdVar7->exponent;
        decSetCoeff(res,&local_240,pdVar7->lsu,pdVar7->digits,local_260,status);
        decFinalize(res,set_00,local_260,status);
        goto LAB_00240b01;
      }
      iVar10 = set->digits;
      res->bits = '\0';
      res->lsu[0] = '\x01';
      res->digits = 1;
      res->exponent = 0;
      iVar4 = decShiftToMost(res->lsu,1,iVar10 + -1);
      res->digits = iVar4;
      res->exponent = 1 - iVar10;
      *status = *status | 0x820;
    }
  }
  else if ((bVar2 & 0x40) == 0) {
    decNaNs(res,rhs,(decNumber *)0x0,set,status);
  }
  else {
    if ((char)bVar2 < '\0') {
      res->bits = '\0';
      res->lsu[0] = '\0';
      goto LAB_00240af1;
    }
    uprv_decNumberCopy_63(res,rhs);
  }
  local_268 = (decNumber *)0x0;
  pdVar5 = (decNumber *)0x0;
  pdVar6 = (decNumber *)0x0;
LAB_00240b01:
  if (local_268 != (decNumber *)0x0) {
    uprv_free_63(local_268);
  }
  if (pdVar6 != (decNumber *)0x0) {
    uprv_free_63(pdVar6);
  }
  if (pdVar5 != (decNumber *)0x0) {
    uprv_free_63(pdVar5);
  }
  return res;
}

Assistant:

decNumber * decExpOp(decNumber *res, const decNumber *rhs,
                         decContext *set, uInt *status) {
  uInt ignore=0;                   /* working status  */
  Int h;                           /* adjusted exponent for 0.xxxx  */
  Int p;                           /* working precision  */
  Int residue;                     /* rounding residue  */
  uInt needbytes;                  /* for space calculations  */
  const decNumber *x=rhs;          /* (may point to safe copy later)  */
  decContext aset, tset, dset;     /* working contexts  */
  Int comp;                        /* work  */

  /* the argument is often copied to normalize it, so (unusually) it  */
  /* is treated like other buffers, using DECBUFFER, +1 in case  */
  /* DECBUFFER is 0  */
  decNumber bufr[D2N(DECBUFFER*2+1)];
  decNumber *allocrhs=NULL;        /* non-NULL if rhs buffer allocated  */

  /* the working precision will be no more than set->digits+8+1  */
  /* so for on-stack buffers DECBUFFER+9 is used, +1 in case DECBUFFER  */
  /* is 0 (and twice that for the accumulator)  */

  /* buffer for t, term (working precision plus)  */
  decNumber buft[D2N(DECBUFFER*2+9+1)];
  decNumber *allocbuft=NULL;       /* -> allocated buft, iff allocated  */
  decNumber *t=buft;               /* term  */
  /* buffer for a, accumulator (working precision * 2), at least 9  */
  decNumber bufa[D2N(DECBUFFER*4+18+1)];
  decNumber *allocbufa=NULL;       /* -> allocated bufa, iff allocated  */
  decNumber *a=bufa;               /* accumulator  */
  /* decNumber for the divisor term; this needs at most 9 digits  */
  /* and so can be fixed size [16 so can use standard context]  */
  decNumber bufd[D2N(16)];
  decNumber *d=bufd;               /* divisor  */
  decNumber numone;                /* constant 1  */

  #if DECCHECK
  Int iterations=0;                /* for later sanity check  */
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  do {                                  /* protect allocated storage  */
    if (SPECIALARG) {                   /* handle infinities and NaNs  */
      if (decNumberIsInfinite(rhs)) {   /* an infinity  */
        if (decNumberIsNegative(rhs))   /* -Infinity -> +0  */
          uprv_decNumberZero(res);
         else uprv_decNumberCopy(res, rhs);  /* +Infinity -> self  */
        }
       else decNaNs(res, rhs, NULL, set, status); /* a NaN  */
      break;}

    if (ISZERO(rhs)) {                  /* zeros -> exact 1  */
      uprv_decNumberZero(res);               /* make clean 1  */
      *res->lsu=1;                      /* ..  */
      break;}                           /* [no status to set]  */

    /* e**x when 0 < x < 0.66 is < 1+3x/2, hence can fast-path  */
    /* positive and negative tiny cases which will result in inexact  */
    /* 1.  This also allows the later add-accumulate to always be  */
    /* exact (because its length will never be more than twice the  */
    /* working precision).  */
    /* The comparator (tiny) needs just one digit, so use the  */
    /* decNumber d for it (reused as the divisor, etc., below); its  */
    /* exponent is such that if x is positive it will have  */
    /* set->digits-1 zeros between the decimal point and the digit,  */
    /* which is 4, and if x is negative one more zero there as the  */
    /* more precise result will be of the form 0.9999999 rather than  */
    /* 1.0000001.  Hence, tiny will be 0.0000004  if digits=7 and x>0  */
    /* or 0.00000004 if digits=7 and x<0.  If RHS not larger than  */
    /* this then the result will be 1.000000  */
    uprv_decNumberZero(d);                   /* clean  */
    *d->lsu=4;                          /* set 4 ..  */
    d->exponent=-set->digits;           /* * 10**(-d)  */
    if (decNumberIsNegative(rhs)) d->exponent--;  /* negative case  */
    comp=decCompare(d, rhs, 1);         /* signless compare  */
    if (comp==BADINT) {
      *status|=DEC_Insufficient_storage;
      break;}
    if (comp>=0) {                      /* rhs < d  */
      Int shift=set->digits-1;
      uprv_decNumberZero(res);               /* set 1  */
      *res->lsu=1;                      /* ..  */
      res->digits=decShiftToMost(res->lsu, 1, shift);
      res->exponent=-shift;                  /* make 1.0000...  */
      *status|=DEC_Inexact | DEC_Rounded;    /* .. inexactly  */
      break;} /* tiny  */

    /* set up the context to be used for calculating a, as this is  */
    /* used on both paths below  */
    uprv_decContextDefault(&aset, DEC_INIT_DECIMAL64);
    /* accumulator bounds are as requested (could underflow)  */
    aset.emax=set->emax;                /* usual bounds  */
    aset.emin=set->emin;                /* ..  */
    aset.clamp=0;                       /* and no concrete format  */

    /* calculate the adjusted (Hull & Abrham) exponent (where the  */
    /* decimal point is just to the left of the coefficient msd)  */
    h=rhs->exponent+rhs->digits;
    /* if h>8 then 10**h cannot be calculated safely; however, when  */
    /* h=8 then exp(|rhs|) will be at least exp(1E+7) which is at  */
    /* least 6.59E+4342944, so (due to the restriction on Emax/Emin)  */
    /* overflow (or underflow to 0) is guaranteed -- so this case can  */
    /* be handled by simply forcing the appropriate excess  */
    if (h>8) {                          /* overflow/underflow  */
      /* set up here so Power call below will over or underflow to  */
      /* zero; set accumulator to either 2 or 0.02  */
      /* [stack buffer for a is always big enough for this]  */
      uprv_decNumberZero(a);
      *a->lsu=2;                        /* not 1 but < exp(1)  */
      if (decNumberIsNegative(rhs)) a->exponent=-2; /* make 0.02  */
      h=8;                              /* clamp so 10**h computable  */
      p=9;                              /* set a working precision  */
      }
     else {                             /* h<=8  */
      Int maxlever=(rhs->digits>8?1:0);
      /* [could/should increase this for precisions >40 or so, too]  */

      /* if h is 8, cannot normalize to a lower upper limit because  */
      /* the final result will not be computable (see notes above),  */
      /* but leverage can be applied whenever h is less than 8.  */
      /* Apply as much as possible, up to a MAXLEVER digits, which  */
      /* sets the tradeoff against the cost of the later a**(10**h).  */
      /* As h is increased, the working precision below also  */
      /* increases to compensate for the "constant digits at the  */
      /* front" effect.  */
      Int lever=MINI(8-h, maxlever);    /* leverage attainable  */
      Int use=-rhs->digits-lever;       /* exponent to use for RHS  */
      h+=lever;                         /* apply leverage selected  */
      if (h<0) {                        /* clamp  */
        use+=h;                         /* [may end up subnormal]  */
        h=0;
        }
      /* Take a copy of RHS if it needs normalization (true whenever x>=1)  */
      if (rhs->exponent!=use) {
        decNumber *newrhs=bufr;         /* assume will fit on stack  */
        needbytes=sizeof(decNumber)+(D2U(rhs->digits)-1)*sizeof(Unit);
        if (needbytes>sizeof(bufr)) {   /* need malloc space  */
          allocrhs=(decNumber *)malloc(needbytes);
          if (allocrhs==NULL) {         /* hopeless -- abandon  */
            *status|=DEC_Insufficient_storage;
            break;}
          newrhs=allocrhs;              /* use the allocated space  */
          }
        uprv_decNumberCopy(newrhs, rhs);     /* copy to safe space  */
        newrhs->exponent=use;           /* normalize; now <1  */
        x=newrhs;                       /* ready for use  */
        /* decNumberShow(x);  */
        }

      /* Now use the usual power series to evaluate exp(x).  The  */
      /* series starts as 1 + x + x^2/2 ... so prime ready for the  */
      /* third term by setting the term variable t=x, the accumulator  */
      /* a=1, and the divisor d=2.  */

      /* First determine the working precision.  From Hull & Abrham  */
      /* this is set->digits+h+2.  However, if x is 'over-precise' we  */
      /* need to allow for all its digits to potentially participate  */
      /* (consider an x where all the excess digits are 9s) so in  */
      /* this case use x->digits+h+2  */
      p=MAXI(x->digits, set->digits)+h+2;    /* [h<=8]  */

      /* a and t are variable precision, and depend on p, so space  */
      /* must be allocated for them if necessary  */

      /* the accumulator needs to be able to hold 2p digits so that  */
      /* the additions on the second and subsequent iterations are  */
      /* sufficiently exact.  */
      needbytes=sizeof(decNumber)+(D2U(p*2)-1)*sizeof(Unit);
      if (needbytes>sizeof(bufa)) {     /* need malloc space  */
        allocbufa=(decNumber *)malloc(needbytes);
        if (allocbufa==NULL) {          /* hopeless -- abandon  */
          *status|=DEC_Insufficient_storage;
          break;}
        a=allocbufa;                    /* use the allocated space  */
        }
      /* the term needs to be able to hold p digits (which is  */
      /* guaranteed to be larger than x->digits, so the initial copy  */
      /* is safe); it may also be used for the raise-to-power  */
      /* calculation below, which needs an extra two digits  */
      needbytes=sizeof(decNumber)+(D2U(p+2)-1)*sizeof(Unit);
      if (needbytes>sizeof(buft)) {     /* need malloc space  */
        allocbuft=(decNumber *)malloc(needbytes);
        if (allocbuft==NULL) {          /* hopeless -- abandon  */
          *status|=DEC_Insufficient_storage;
          break;}
        t=allocbuft;                    /* use the allocated space  */
        }

      uprv_decNumberCopy(t, x);              /* term=x  */
      uprv_decNumberZero(a); *a->lsu=1;      /* accumulator=1  */
      uprv_decNumberZero(d); *d->lsu=2;      /* divisor=2  */
      uprv_decNumberZero(&numone); *numone.lsu=1; /* constant 1 for increment  */

      /* set up the contexts for calculating a, t, and d  */
      uprv_decContextDefault(&tset, DEC_INIT_DECIMAL64);
      dset=tset;
      /* accumulator bounds are set above, set precision now  */
      aset.digits=p*2;                  /* double  */
      /* term bounds avoid any underflow or overflow  */
      tset.digits=p;
      tset.emin=DEC_MIN_EMIN;           /* [emax is plenty]  */
      /* [dset.digits=16, etc., are sufficient]  */

      /* finally ready to roll  */
      for (;;) {
        #if DECCHECK
        iterations++;
        #endif
        /* only the status from the accumulation is interesting  */
        /* [but it should remain unchanged after first add]  */
        decAddOp(a, a, t, &aset, 0, status);           /* a=a+t  */
        decMultiplyOp(t, t, x, &tset, &ignore);        /* t=t*x  */
        decDivideOp(t, t, d, &tset, DIVIDE, &ignore);  /* t=t/d  */
        /* the iteration ends when the term cannot affect the result,  */
        /* if rounded to p digits, which is when its value is smaller  */
        /* than the accumulator by p+1 digits.  There must also be  */
        /* full precision in a.  */
        if (((a->digits+a->exponent)>=(t->digits+t->exponent+p+1))
            && (a->digits>=p)) break;
        decAddOp(d, d, &numone, &dset, 0, &ignore);    /* d=d+1  */
        } /* iterate  */

      #if DECCHECK
      /* just a sanity check; comment out test to show always  */
      if (iterations>p+3)
        printf("Exp iterations=%ld, status=%08lx, p=%ld, d=%ld\n",
               (LI)iterations, (LI)*status, (LI)p, (LI)x->digits);
      #endif
      } /* h<=8  */

    /* apply postconditioning: a=a**(10**h) -- this is calculated  */
    /* at a slightly higher precision than Hull & Abrham suggest  */
    if (h>0) {
      Int seenbit=0;               /* set once a 1-bit is seen  */
      Int i;                       /* counter  */
      Int n=powers[h];             /* always positive  */
      aset.digits=p+2;             /* sufficient precision  */
      /* avoid the overhead and many extra digits of decNumberPower  */
      /* as all that is needed is the short 'multipliers' loop; here  */
      /* accumulate the answer into t  */
      uprv_decNumberZero(t); *t->lsu=1; /* acc=1  */
      for (i=1;;i++){              /* for each bit [top bit ignored]  */
        /* abandon if have had overflow or terminal underflow  */
        if (*status & (DEC_Overflow|DEC_Underflow)) { /* interesting?  */
          if (*status&DEC_Overflow || ISZERO(t)) break;}
        n=n<<1;                    /* move next bit to testable position  */
        if (n<0) {                 /* top bit is set  */
          seenbit=1;               /* OK, have a significant bit  */
          decMultiplyOp(t, t, a, &aset, status); /* acc=acc*x  */
          }
        if (i==31) break;          /* that was the last bit  */
        if (!seenbit) continue;    /* no need to square 1  */
        decMultiplyOp(t, t, t, &aset, status); /* acc=acc*acc [square]  */
        } /*i*/ /* 32 bits  */
      /* decNumberShow(t);  */
      a=t;                         /* and carry on using t instead of a  */
      }

    /* Copy and round the result to res  */
    residue=1;                          /* indicate dirt to right ..  */
    if (ISZERO(a)) residue=0;           /* .. unless underflowed to 0  */
    aset.digits=set->digits;            /* [use default rounding]  */
    decCopyFit(res, a, &aset, &residue, status); /* copy & shorten  */
    decFinish(res, set, &residue, status);       /* cleanup/set flags  */
    } while(0);                         /* end protected  */

  if (allocrhs !=NULL) free(allocrhs);  /* drop any storage used  */
  if (allocbufa!=NULL) free(allocbufa); /* ..  */
  if (allocbuft!=NULL) free(allocbuft); /* ..  */
  /* [status is handled by caller]  */
  return res;
  }